

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint32_t farmhashmk::Hash32Len0to4(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  ulong in_RSI;
  char v;
  size_t i;
  uint32_t c;
  uint32_t b;
  undefined8 local_28;
  
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
  }
  util::Mur(0,0x20882f);
  uVar1 = util::Mur(0,0x20883a);
  uVar1 = util::fmix(uVar1);
  return uVar1;
}

Assistant:

STATIC_INLINE uint32_t Hash32Len0to4(const char *s, size_t len, uint32_t seed = 0) {
  uint32_t b = seed;
  uint32_t c = 9;
  for (size_t i = 0; i < len; i++) {
    signed char v = s[i];
    b = b * c1 + v;
    c ^= b;
  }
  return fmix(Mur(b, Mur(len, c)));
}